

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O0

void avx::Invert(uint32_t rowSizeIn,uint32_t rowSizeOut,uint8_t *inY,uint8_t *outY,uint8_t *outYEnd,
                uint32_t simdWidth,uint32_t totalSimdWidth,uint32_t nonSimdWidth)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  byte *pbVar4;
  undefined8 *in_RCX;
  undefined1 (*in_RDX) [32];
  uint in_ESI;
  uint in_EDI;
  undefined8 *in_R8;
  uint in_R9D;
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  uint in_stack_00000008;
  uint8_t *inX;
  simd *src1End;
  simd *dst;
  simd *src1;
  simd mask;
  char maskValue;
  byte *local_188;
  byte *local_180;
  undefined8 *local_170;
  undefined1 (*local_168) [32];
  undefined8 *local_120;
  undefined1 (*local_118) [32];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  
  auVar1 = vpinsrb_avx(ZEXT116(0xff),0xff,1);
  auVar1 = vpinsrb_avx(auVar1,0xff,2);
  auVar1 = vpinsrb_avx(auVar1,0xff,3);
  auVar1 = vpinsrb_avx(auVar1,0xff,4);
  auVar1 = vpinsrb_avx(auVar1,0xff,5);
  auVar1 = vpinsrb_avx(auVar1,0xff,6);
  auVar1 = vpinsrb_avx(auVar1,0xff,7);
  auVar1 = vpinsrb_avx(auVar1,0xff,8);
  auVar1 = vpinsrb_avx(auVar1,0xff,9);
  auVar1 = vpinsrb_avx(auVar1,0xff,10);
  auVar1 = vpinsrb_avx(auVar1,0xff,0xb);
  auVar1 = vpinsrb_avx(auVar1,0xff,0xc);
  auVar1 = vpinsrb_avx(auVar1,0xff,0xd);
  auVar1 = vpinsrb_avx(auVar1,0xff,0xe);
  auVar1 = vpinsrb_avx(auVar1,0xff,0xf);
  auVar2 = vpinsrb_avx(ZEXT116(0xff),0xff,1);
  auVar2 = vpinsrb_avx(auVar2,0xff,2);
  auVar2 = vpinsrb_avx(auVar2,0xff,3);
  auVar2 = vpinsrb_avx(auVar2,0xff,4);
  auVar2 = vpinsrb_avx(auVar2,0xff,5);
  auVar2 = vpinsrb_avx(auVar2,0xff,6);
  auVar2 = vpinsrb_avx(auVar2,0xff,7);
  auVar2 = vpinsrb_avx(auVar2,0xff,8);
  auVar2 = vpinsrb_avx(auVar2,0xff,9);
  auVar2 = vpinsrb_avx(auVar2,0xff,10);
  auVar2 = vpinsrb_avx(auVar2,0xff,0xb);
  auVar2 = vpinsrb_avx(auVar2,0xff,0xc);
  auVar2 = vpinsrb_avx(auVar2,0xff,0xd);
  auVar2 = vpinsrb_avx(auVar2,0xff,0xe);
  auVar2 = vpinsrb_avx(auVar2,0xff,0xf);
  auVar6 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
  uStack_b0 = auVar6._0_8_;
  uStack_a8 = auVar6._8_8_;
  local_118 = in_RDX;
  for (local_120 = in_RCX; local_120 != in_R8;
      local_120 = (undefined8 *)((long)local_120 + (ulong)in_ESI)) {
    local_170 = local_120;
    for (local_168 = local_118; local_168 != local_118 + in_R9D; local_168 = local_168 + 1) {
      auVar3 = *local_168;
      auVar5 = vpternlogq_avx512vl(auVar3,auVar3,auVar3,0xf);
      auVar3._16_8_ = uStack_b0;
      auVar3._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
      auVar3._24_8_ = uStack_a8;
      auVar3 = vpand_avx2(auVar5,auVar3);
      local_100 = auVar3._0_8_;
      uStack_f8 = auVar3._8_8_;
      uStack_f0 = auVar3._16_8_;
      uStack_e8 = auVar3._24_8_;
      *local_170 = local_100;
      local_170[1] = uStack_f8;
      local_170[2] = uStack_f0;
      local_170[3] = uStack_e8;
      local_170 = local_170 + 4;
    }
    if (totalSimdWidth != 0) {
      local_180 = *local_118 + in_stack_00000008;
      local_188 = (byte *)((long)local_120 + (ulong)in_stack_00000008);
      pbVar4 = local_188 + totalSimdWidth;
      for (; local_188 != pbVar4; local_188 = local_188 + 1) {
        *local_188 = *local_180 ^ 0xff;
        local_180 = local_180 + 1;
      }
    }
    local_118 = (undefined1 (*) [32])(*local_118 + in_EDI);
  }
  return;
}

Assistant:

void Invert( uint32_t rowSizeIn, uint32_t rowSizeOut, const uint8_t * inY, uint8_t * outY, const uint8_t * outYEnd,
                 uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        const char maskValue = static_cast<char>(0xffu);
        const simd mask = _mm256_set_epi8(
            maskValue, maskValue, maskValue, maskValue, maskValue, maskValue, maskValue, maskValue,
            maskValue, maskValue, maskValue, maskValue, maskValue, maskValue, maskValue, maskValue,
            maskValue, maskValue, maskValue, maskValue, maskValue, maskValue, maskValue, maskValue,
            maskValue, maskValue, maskValue, maskValue, maskValue, maskValue, maskValue, maskValue );

        for( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
            const simd * src1 = reinterpret_cast <const simd*> (inY);
            simd       * dst  = reinterpret_cast <simd*> (outY);

            const simd * src1End = src1 + simdWidth;

            for( ; src1 != src1End; ++src1, ++dst )
                _mm256_storeu_si256( dst, _mm256_andnot_si256( _mm256_loadu_si256( src1 ), mask ) );

            if( nonSimdWidth > 0 ) {
                const uint8_t * inX  = inY  + totalSimdWidth;
                uint8_t       * outX = outY + totalSimdWidth;

                const uint8_t * outXEnd = outX + nonSimdWidth;

                for( ; outX != outXEnd; ++outX, ++inX )
                    (*outX) = ~(*inX);
            }
        }
    }